

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetrahedron_monte_carlo.cpp
# Opt level: O1

double * monomial_value(int m,int n,int *e,double *x)

{
  double dVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  double *pdVar5;
  double dVar6;
  double *local_40;
  
  uVar3 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar3 = (long)n * 8;
  }
  pdVar2 = (double *)operator_new__(uVar3);
  if (0 < n) {
    uVar3 = 0;
    do {
      pdVar2[uVar3] = 1.0;
      uVar3 = uVar3 + 1;
    } while ((uint)n != uVar3);
  }
  if (0 < m) {
    uVar3 = 0;
    local_40 = x;
    do {
      if (e[uVar3] != 0 && 0 < n) {
        uVar4 = 0;
        pdVar5 = local_40;
        do {
          dVar1 = pdVar2[uVar4];
          dVar6 = pow(*pdVar5,(double)e[uVar3]);
          pdVar2[uVar4] = dVar6 * dVar1;
          uVar4 = uVar4 + 1;
          pdVar5 = pdVar5 + (uint)m;
        } while ((uint)n != uVar4);
      }
      uVar3 = uVar3 + 1;
      local_40 = local_40 + 1;
    } while (uVar3 != (uint)m);
  }
  return pdVar2;
}

Assistant:

double *monomial_value ( int m, int n, int e[], double x[] )

//****************************************************************************80
//
//  Purpose:
//
//    MONOMIAL_VALUE evaluates a monomial.
//
//  Discussion:
//
//    This routine evaluates a monomial of the form
//
//      product ( 1 <= i <= m ) x(i)^e(i)
//
//    where the exponents are nonnegative integers.  Note that
//    if the combination 0^0 is encountered, it should be treated
//    as 1.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    05 May 2007
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int M, the spatial dimension.
//
//    Input, int POINT_NUM, the number of points at which the
//    monomial is to be evaluated.
//
//    Input, int E[M], the exponents.
//
//    Input, double X[M*N], the point coordinates.
//
//    Output, double MONOMIAL_VALUE[N], the value of the monomial.
//
{
  int i;
  int j;
  double *v;

  v = new double[n];

  for ( j = 0; j < n; j++ )
  {
    v[j] = 1.0;
  }

  for ( i = 0; i < m; i++ )
  {
    if ( 0 != e[i] )
    {
      for ( j = 0; j < n; j++ )
      {
        v[j] = v[j] * pow ( x[i+j*m], e[i] );
      }
    }
  }

  return v;
}